

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O3

NodeRefPtr<4> __thiscall
embree::sse2::BVHBuilderBinnedFastSpatialSAH::
CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleM<4>>>::
operator()(CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleM<4>>>
           *this,PrimRef *prims,range<unsigned_long> *range,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  pointer *pppTVar3;
  ThreadLocal2 *this_00;
  iterator __position;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  undefined1 *puVar14;
  float *pfVar15;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  Vec3vf<4> v0;
  Vec3vf<4> v1;
  Vec3vf<4> v2;
  vuint<4> vprimID;
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  ulong local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8 [8];
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8 [8];
  range<unsigned_long> *local_88;
  CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleM<4>>>
  *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68 [14];
  
  uVar19 = range->_begin;
  uVar25 = range->_end;
  if (uVar19 < uVar25) {
    puVar14 = (undefined1 *)((long)&prims[uVar19].lower.field_0 + 0xc);
    do {
      puVar14[3] = puVar14[3] & 7;
      uVar19 = uVar19 + 1;
      uVar25 = range->_end;
      puVar14 = puVar14 + 0x20;
    } while (uVar19 < uVar25);
    uVar19 = range->_begin;
  }
  uVar25 = (uVar25 - uVar19) + 3;
  local_f0 = uVar25 >> 2;
  local_108 = local_f0 * 0xb0;
  this_00 = (alloc.talloc1)->parent;
  local_80 = this;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    uStack_b0 = CONCAT71(uStack_b0._1_7_,1);
    local_b8 = this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_e8 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_e0 = CONCAT71(uStack_e0._1_7_,1);
    local_78 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,__position,(ThreadLocal2 **)&local_78);
    }
    else {
      *__position._M_current = this_00;
      pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if ((char)uStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  uVar23 = local_108;
  (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + local_108;
  sVar16 = (alloc.talloc1)->cur;
  uVar17 = (ulong)(-(int)sVar16 & 0xf);
  uVar20 = sVar16 + local_108 + uVar17;
  (alloc.talloc1)->cur = uVar20;
  if ((alloc.talloc1)->end < uVar20) {
    (alloc.talloc1)->cur = sVar16;
    uVar17 = (alloc.talloc1)->allocBlockSize;
    if (local_108 * 4 < uVar17 || local_108 * 4 - uVar17 == 0) {
      local_e8 = (undefined8 *)uVar17;
      pcVar21 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_e8);
      (alloc.talloc1)->ptr = pcVar21;
      sVar16 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
      (alloc.talloc1)->bytesWasted = sVar16;
      (alloc.talloc1)->end = (size_t)local_e8;
      (alloc.talloc1)->cur = uVar23;
      if (local_e8 < uVar23) {
        (alloc.talloc1)->cur = 0;
        local_e8 = (undefined8 *)(alloc.talloc1)->allocBlockSize;
        pcVar21 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_e8);
        (alloc.talloc1)->ptr = pcVar21;
        sVar16 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar16;
        (alloc.talloc1)->end = (size_t)local_e8;
        (alloc.talloc1)->cur = uVar23;
        if (local_e8 < uVar23) {
          (alloc.talloc1)->cur = 0;
          pcVar21 = (char *)0x0;
        }
        else {
          (alloc.talloc1)->bytesWasted = sVar16;
        }
      }
      else {
        (alloc.talloc1)->bytesWasted = sVar16;
      }
    }
    else {
      pcVar21 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_108);
    }
  }
  else {
    (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar17;
    pcVar21 = (alloc.talloc1)->ptr + (uVar20 - local_108);
  }
  if (3 < uVar25) {
    lVar22 = local_f0 + (local_f0 == 0);
    lVar18 = 0;
    local_88 = range;
    do {
      uVar25 = range->_end;
      fVar29 = -NAN;
      fVar26 = -NAN;
      fVar27 = -NAN;
      fVar28 = -NAN;
      local_108._0_4_ = -NAN;
      local_108._4_4_ = -NAN;
      fStack_100 = -NAN;
      fStack_fc = -NAN;
      local_68[8] = -NAN;
      local_68[9] = -NAN;
      local_68[10] = -NAN;
      local_68[0xb] = -NAN;
      local_d8[4] = 0.0;
      local_d8[5] = 0.0;
      local_d8[6] = 0.0;
      local_d8[7] = 0.0;
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      local_d8[3] = 0.0;
      local_e8 = (undefined8 *)0x0;
      uStack_e0 = 0;
      local_a8[4] = 0.0;
      local_a8[5] = 0.0;
      local_a8[6] = 0.0;
      local_a8[7] = 0.0;
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      local_a8[3] = 0.0;
      local_b8 = (ThreadLocal2 *)0x0;
      uStack_b0 = 0;
      local_68[4] = 0.0;
      local_68[5] = 0.0;
      local_68[6] = 0.0;
      local_68[7] = 0.0;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      local_68[3] = 0.0;
      local_78 = (ThreadLocal2 *)0x0;
      uStack_70 = 0;
      if (uVar19 < uVar25) {
        lVar4 = *(long *)(*(long *)(*(long *)local_80 + 0x68) + 0x1e8);
        pfVar15 = prims[uVar19].upper.field_0.m128 + 3;
        uVar23 = 0;
        do {
          fVar26 = *pfVar15;
          lVar5 = *(long *)(lVar4 + (ulong)(uint)pfVar15[-4] * 8);
          lVar24 = (ulong)(uint)fVar26 * *(long *)(lVar5 + 0x68);
          lVar6 = *(long *)(lVar5 + 0x58);
          lVar7 = *(long *)(lVar5 + 0x90);
          lVar5 = *(long *)(lVar5 + 0xa0);
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + lVar24) * lVar5);
          uVar8 = *puVar2;
          fVar27 = (float)puVar2[1];
          fVar28 = (float)puVar2[2];
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + 4 + lVar24) * lVar5);
          uVar9 = *puVar2;
          fVar29 = (float)puVar2[1];
          fVar10 = (float)puVar2[2];
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + 8 + lVar24) * lVar5);
          uVar11 = *puVar2;
          fVar12 = (float)puVar2[1];
          fVar13 = (float)puVar2[2];
          *(float *)((long)&local_108 + uVar23 * 4) = pfVar15[-4];
          local_68[uVar23 + 8] = fVar26;
          *(undefined4 *)((long)&local_e8 + uVar23 * 4) = uVar8;
          local_d8[uVar23] = fVar27;
          local_d8[uVar23 + 4] = fVar28;
          *(undefined4 *)((long)&local_b8 + uVar23 * 4) = uVar9;
          local_a8[uVar23] = fVar29;
          local_a8[uVar23 + 4] = fVar10;
          *(undefined4 *)((long)&local_78 + uVar23 * 4) = uVar11;
          local_68[uVar23] = fVar12;
          local_68[uVar23 + 4] = fVar13;
          uVar17 = uVar23 + 1;
          if (2 < uVar23) break;
          lVar5 = uVar23 + uVar19;
          pfVar15 = pfVar15 + 8;
          uVar23 = uVar17;
        } while (lVar5 + 1U < uVar25);
        uVar19 = uVar19 + uVar17;
        range = local_88;
        fVar26 = local_68[8];
        fVar27 = local_68[9];
        fVar28 = local_68[10];
        fVar29 = local_68[0xb];
      }
      else {
        fStack_fc = -NAN;
        local_108._0_4_ = -NAN;
        local_108._4_4_ = -NAN;
        fStack_100 = -NAN;
        local_68[4] = 0.0;
        local_68[5] = 0.0;
        local_68[6] = 0.0;
        local_68[7] = 0.0;
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        local_68[2] = 0.0;
        local_68[3] = 0.0;
        local_78._0_4_ = 0.0;
        local_78._4_4_ = 0.0;
        uStack_70._0_4_ = 0.0;
        uStack_70._4_4_ = 0.0;
        local_a8[4] = 0.0;
        local_a8[5] = 0.0;
        local_a8[6] = 0.0;
        local_a8[7] = 0.0;
        local_a8[0] = 0.0;
        local_a8[1] = 0.0;
        local_a8[2] = 0.0;
        local_a8[3] = 0.0;
        local_b8._0_4_ = 0.0;
        local_b8._4_4_ = 0.0;
        uStack_b0._0_4_ = 0.0;
        uStack_b0._4_4_ = 0.0;
        local_d8[4] = 0.0;
        local_d8[5] = 0.0;
        local_d8[6] = 0.0;
        local_d8[7] = 0.0;
        local_d8[0] = 0.0;
        local_d8[1] = 0.0;
        local_d8[2] = 0.0;
        local_d8[3] = 0.0;
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        uStack_e0._0_4_ = 0.0;
        uStack_e0._4_4_ = 0.0;
      }
      pfVar15 = (float *)(pcVar21 + lVar18 * 0xb0);
      *pfVar15 = (float)local_e8;
      pfVar15[1] = local_e8._4_4_;
      pfVar15[2] = (float)uStack_e0;
      pfVar15[3] = uStack_e0._4_4_;
      pfVar15[4] = local_d8[0];
      pfVar15[5] = local_d8[1];
      pfVar15[6] = local_d8[2];
      pfVar15[7] = local_d8[3];
      pfVar15[8] = local_d8[4];
      pfVar15[9] = local_d8[5];
      pfVar15[10] = local_d8[6];
      pfVar15[0xb] = local_d8[7];
      pfVar15[0xc] = (float)local_e8 - (float)local_b8;
      pfVar15[0xd] = local_e8._4_4_ - local_b8._4_4_;
      pfVar15[0xe] = (float)uStack_e0 - (float)uStack_b0;
      pfVar15[0xf] = uStack_e0._4_4_ - uStack_b0._4_4_;
      pfVar15[0x10] = local_d8[0] - local_a8[0];
      pfVar15[0x11] = local_d8[1] - local_a8[1];
      pfVar15[0x12] = local_d8[2] - local_a8[2];
      pfVar15[0x13] = local_d8[3] - local_a8[3];
      pfVar15[0x14] = local_d8[4] - local_a8[4];
      pfVar15[0x15] = local_d8[5] - local_a8[5];
      pfVar15[0x16] = local_d8[6] - local_a8[6];
      pfVar15[0x17] = local_d8[7] - local_a8[7];
      pfVar15[0x18] = (float)local_78 - (float)local_e8;
      pfVar15[0x19] = local_78._4_4_ - local_e8._4_4_;
      pfVar15[0x1a] = (float)uStack_70 - (float)uStack_e0;
      pfVar15[0x1b] = uStack_70._4_4_ - uStack_e0._4_4_;
      pfVar15[0x1c] = local_68[0] - local_d8[0];
      pfVar15[0x1d] = local_68[1] - local_d8[1];
      pfVar15[0x1e] = local_68[2] - local_d8[2];
      pfVar15[0x1f] = local_68[3] - local_d8[3];
      pfVar15[0x20] = local_68[4] - local_d8[4];
      pfVar15[0x21] = local_68[5] - local_d8[5];
      pfVar15[0x22] = local_68[6] - local_d8[6];
      pfVar15[0x23] = local_68[7] - local_d8[7];
      pfVar15[0x24] = (float)local_108;
      pfVar15[0x25] = local_108._4_4_;
      pfVar15[0x26] = fStack_100;
      pfVar15[0x27] = fStack_fc;
      pfVar15[0x28] = fVar26;
      pfVar15[0x29] = fVar27;
      pfVar15[0x2a] = fVar28;
      pfVar15[0x2b] = fVar29;
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar22);
  }
  uVar19 = 7;
  if (local_f0 < 7) {
    uVar19 = local_f0;
  }
  return (NodeRefPtr<4>)(uVar19 | (ulong)pcVar21 | 8);
}

Assistant:

__noinline ReductionTy operator() (PrimRef* prims, const range<size_t>& range, Allocator alloc) const
        {
          for (size_t i=range.begin(); i<range.end(); i++)
            prims[i].lower.u &= GEOMID_MASK;

          return userCreateLeaf(prims,range,alloc);
        }